

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cookie.c
# Opt level: O3

Cookie * Curl_cookie_getlist(CookieInfo *c,char *host,char *path,_Bool secure)

{
  char cVar1;
  undefined8 *puVar2;
  _Bool _Var3;
  byte bVar4;
  _Bool _Var5;
  int iVar6;
  size_t sVar7;
  size_t sVar8;
  Cookie *pCVar9;
  char *pcVar10;
  char *__s;
  char *pcVar11;
  size_t sVar12;
  undefined8 *__base;
  Cookie *pCVar13;
  Cookie *pCVar14;
  size_t __nmemb;
  
  sVar7 = cookiehash(host);
  if ((c != (CookieInfo *)0x0) && (c->cookies[sVar7] != (Cookie *)0x0)) {
    remove_expired(c);
    _Var3 = isip(host);
    pCVar14 = c->cookies[sVar7];
    if (pCVar14 != (Cookie *)0x0) {
      pCVar13 = (Cookie *)0x0;
      __nmemb = 0;
      do {
        if ((byte)(pCVar14->secure ^ 1U | secure) != 1) goto LAB_0011c2b2;
        if (pCVar14->domain != (char *)0x0) {
          bVar4 = pCVar14->tailmatch ^ 1;
          if ((bVar4 & 1) == 0 && !_Var3) {
            _Var5 = tailmatch(pCVar14->domain,host);
            if (_Var5) goto LAB_0011c0c0;
            bVar4 = pCVar14->tailmatch ^ 1;
          }
          if (((bVar4 & 1) == 0 && !_Var3) ||
             (iVar6 = Curl_strcasecompare(host,pCVar14->domain), iVar6 == 0)) goto LAB_0011c2b2;
        }
LAB_0011c0c0:
        pcVar10 = pCVar14->spath;
        if ((pcVar10 == (char *)0x0) || (sVar8 = strlen(pcVar10), sVar8 == 1)) goto LAB_0011c0dc;
        __s = (*Curl_cstrdup)(path);
        if (__s != (char *)0x0) {
          pcVar11 = strchr(__s,0x3f);
          if (pcVar11 != (char *)0x0) {
            *pcVar11 = '\0';
          }
          if (*__s != '/') {
            (*Curl_cfree)(__s);
            __s = (*Curl_cstrdup)("/");
            if (__s == (char *)0x0) goto LAB_0011c2b2;
          }
          sVar12 = strlen(__s);
          if ((sVar12 < sVar8) || (iVar6 = strncmp(pcVar10,__s,sVar8), iVar6 != 0)) {
            (*Curl_cfree)(__s);
          }
          else {
            if (sVar8 == sVar12) {
              (*Curl_cfree)(__s);
            }
            else {
              cVar1 = __s[sVar8];
              (*Curl_cfree)(__s);
              if (cVar1 != '/') goto LAB_0011c2b2;
            }
LAB_0011c0dc:
            pCVar9 = (Cookie *)(*Curl_ccalloc)(0x68,1);
            if (pCVar9 == (Cookie *)0x0) goto joined_r0x0011c307;
            if (pCVar14->expirestr != (char *)0x0) {
              pcVar10 = (*Curl_cstrdup)(pCVar14->expirestr);
              pCVar9->expirestr = pcVar10;
              if (pcVar10 != (char *)0x0) goto LAB_0011c11d;
LAB_0011c2fc:
              freecookie(pCVar9);
              goto joined_r0x0011c307;
            }
LAB_0011c11d:
            if (pCVar14->domain != (char *)0x0) {
              pcVar10 = (*Curl_cstrdup)(pCVar14->domain);
              pCVar9->domain = pcVar10;
              if (pcVar10 == (char *)0x0) goto LAB_0011c2fc;
            }
            if (pCVar14->path != (char *)0x0) {
              pcVar10 = (*Curl_cstrdup)(pCVar14->path);
              pCVar9->path = pcVar10;
              if (pcVar10 == (char *)0x0) goto LAB_0011c2fc;
            }
            if (pCVar14->spath != (char *)0x0) {
              pcVar10 = (*Curl_cstrdup)(pCVar14->spath);
              pCVar9->spath = pcVar10;
              if (pcVar10 == (char *)0x0) goto LAB_0011c2fc;
            }
            if (pCVar14->name != (char *)0x0) {
              pcVar10 = (*Curl_cstrdup)(pCVar14->name);
              pCVar9->name = pcVar10;
              if (pcVar10 == (char *)0x0) goto LAB_0011c2fc;
            }
            if (pCVar14->value != (char *)0x0) {
              pcVar10 = (*Curl_cstrdup)(pCVar14->value);
              pCVar9->value = pcVar10;
              if (pcVar10 == (char *)0x0) goto LAB_0011c2fc;
            }
            if (pCVar14->maxage != (char *)0x0) {
              pcVar10 = (*Curl_cstrdup)(pCVar14->maxage);
              pCVar9->maxage = pcVar10;
              if (pcVar10 == (char *)0x0) goto LAB_0011c2fc;
            }
            if (pCVar14->version != (char *)0x0) {
              pcVar10 = (*Curl_cstrdup)(pCVar14->version);
              pCVar9->version = pcVar10;
              if (pcVar10 == (char *)0x0) goto LAB_0011c2fc;
            }
            pCVar9->expires = pCVar14->expires;
            pCVar9->tailmatch = pCVar14->tailmatch;
            pCVar9->secure = pCVar14->secure;
            pCVar9->livecookie = pCVar14->livecookie;
            pCVar9->httponly = pCVar14->httponly;
            pCVar9->creationtime = pCVar14->creationtime;
            pCVar9->next = pCVar13;
            __nmemb = __nmemb + 1;
            pCVar13 = pCVar9;
          }
        }
LAB_0011c2b2:
        pCVar14 = pCVar14->next;
      } while (pCVar14 != (Cookie *)0x0);
      if (__nmemb == 0) {
        return pCVar13;
      }
      __base = (undefined8 *)(*Curl_cmalloc)(__nmemb * 8);
      puVar2 = __base;
      if (__base != (undefined8 *)0x0) {
        for (; pCVar13 != (Cookie *)0x0; pCVar13 = pCVar13->next) {
          *puVar2 = pCVar13;
          puVar2 = puVar2 + 1;
        }
        qsort(__base,__nmemb,8,cookie_sort);
        pCVar14 = (Cookie *)*__base;
        if (__nmemb != 1) {
          sVar8 = 1;
          pCVar13 = pCVar14;
          do {
            pCVar9 = (Cookie *)__base[sVar8];
            pCVar13->next = pCVar9;
            sVar8 = sVar8 + 1;
            pCVar13 = pCVar9;
          } while (__nmemb != sVar8);
        }
        *(undefined8 *)__base[__nmemb - 1] = 0;
        (*Curl_cfree)(__base);
        return pCVar14;
      }
joined_r0x0011c307:
      while (pCVar13 != (Cookie *)0x0) {
        pCVar14 = pCVar13->next;
        freecookie(pCVar13);
        pCVar13 = pCVar14;
      }
    }
  }
  return (Cookie *)0x0;
}

Assistant:

struct Cookie *Curl_cookie_getlist(struct CookieInfo *c,
                                   const char *host, const char *path,
                                   bool secure)
{
  struct Cookie *newco;
  struct Cookie *co;
  struct Cookie *mainco = NULL;
  size_t matches = 0;
  bool is_ip;
  const size_t myhash = cookiehash(host);

  if(!c || !c->cookies[myhash])
    return NULL; /* no cookie struct or no cookies in the struct */

  /* at first, remove expired cookies */
  remove_expired(c);

  /* check if host is an IP(v4|v6) address */
  is_ip = isip(host);

  co = c->cookies[myhash];

  while(co) {
    /* if the cookie requires we're secure we must only continue if we are! */
    if(co->secure?secure:TRUE) {

      /* now check if the domain is correct */
      if(!co->domain ||
         (co->tailmatch && !is_ip && tailmatch(co->domain, host)) ||
         ((!co->tailmatch || is_ip) && strcasecompare(host, co->domain)) ) {
        /* the right part of the host matches the domain stuff in the
           cookie data */

        /* now check the left part of the path with the cookies path
           requirement */
        if(!co->spath || pathmatch(co->spath, path) ) {

          /* and now, we know this is a match and we should create an
             entry for the return-linked-list */

          newco = dup_cookie(co);
          if(newco) {
            /* then modify our next */
            newco->next = mainco;

            /* point the main to us */
            mainco = newco;

            matches++;
          }
          else
            goto fail;
        }
      }
    }
    co = co->next;
  }

  if(matches) {
    /* Now we need to make sure that if there is a name appearing more than
       once, the longest specified path version comes first. To make this
       the swiftest way, we just sort them all based on path length. */
    struct Cookie **array;
    size_t i;

    /* alloc an array and store all cookie pointers */
    array = malloc(sizeof(struct Cookie *) * matches);
    if(!array)
      goto fail;

    co = mainco;

    for(i = 0; co; co = co->next)
      array[i++] = co;

    /* now sort the cookie pointers in path length order */
    qsort(array, matches, sizeof(struct Cookie *), cookie_sort);

    /* remake the linked list order according to the new order */

    mainco = array[0]; /* start here */
    for(i = 0; i<matches-1; i++)
      array[i]->next = array[i + 1];
    array[matches-1]->next = NULL; /* terminate the list */

    free(array); /* remove the temporary data again */
  }

  return mainco; /* return the new list */

fail:
  /* failure, clear up the allocated chain and return NULL */
  Curl_cookie_freelist(mainco);
  return NULL;
}